

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string linkProp;
  string suffix;
  char *imp;
  char *loc;
  string local_a0;
  string local_80;
  string local_60;
  char *local_40;
  char *local_38;
  
  info->NoSOName = false;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar2 = cmTarget::GetMappedConfig(this->Target,desired_config,&local_38,&local_40,&local_60);
  if (!bVar2) goto LAB_0038938f;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"INTERFACE_LINK_LIBRARIES","")
  ;
  pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
  if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x4cdeff);
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
      pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    }
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x4cdeff);
      pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    }
  }
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
    pcVar1 = (char *)(info->Libraries)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&info->Libraries,0,pcVar1,(ulong)pcVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_38;
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) goto LAB_0038938f;
  if (local_38 == (char *)0x0) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"IMPORTED_LOCATION","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    if (pcVar3 == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IMPORTED_LOCATION","");
      pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        pcVar1 = (char *)(info->Location)._M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar1,(ulong)pcVar3);
      }
    }
    else {
      pcVar1 = (char *)(info->Location)._M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar1,(ulong)pcVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar1 = (char *)(info->Location)._M_string_length;
    strlen(local_38);
    std::__cxx11::string::_M_replace((ulong)&info->Location,0,pcVar1,(ulong)pcVar3);
  }
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"IMPORTED_SONAME","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    if (pcVar3 == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IMPORTED_SONAME","");
      pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        pcVar1 = (char *)(info->SOName)._M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&info->SOName,0,pcVar1,(ulong)pcVar3);
      }
    }
    else {
      pcVar1 = (char *)(info->SOName)._M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&info->SOName,0,pcVar1,(ulong)pcVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  paVar4 = &local_a0.field_2;
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    local_a0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"IMPORTED_NO_SONAME","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    if (pcVar3 == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IMPORTED_NO_SONAME","");
      pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        bVar2 = cmSystemTools::IsOn(pcVar3);
        goto LAB_00388f61;
      }
    }
    else {
      bVar2 = cmSystemTools::IsOn(pcVar3);
LAB_00388f61:
      info->NoSOName = bVar2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar4) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar3 = local_40;
  if (local_40 == (char *)0x0) {
    if (this->Target->TargetTypeValue != SHARED_LIBRARY) {
      bVar2 = IsExecutableWithExports(this);
      if (!bVar2) goto LAB_003890ac;
    }
    local_a0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"IMPORTED_IMPLIB","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    if (pcVar3 == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IMPORTED_IMPLIB","");
      pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)&info->ImportLibrary,pcVar3);
      }
    }
    else {
      pcVar1 = (char *)(info->ImportLibrary)._M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&info->ImportLibrary,0,pcVar1,(ulong)pcVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar1 = (char *)(info->ImportLibrary)._M_string_length;
    strlen(local_40);
    std::__cxx11::string::_M_replace((ulong)&info->ImportLibrary,0,pcVar1,(ulong)pcVar3);
  }
LAB_003890ac:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"IMPORTED_LINK_DEPENDENT_LIBRARIES","");
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
  pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
  if (pcVar3 == (char *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"IMPORTED_LINK_DEPENDENT_LIBRARIES","");
    pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) {
      pcVar1 = (char *)(info->SharedDeps)._M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&info->SharedDeps,0,pcVar1,(ulong)pcVar3);
    }
  }
  else {
    pcVar1 = (char *)(info->SharedDeps)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&info->SharedDeps,0,pcVar1,(ulong)pcVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (this->Target->TargetTypeValue == STATIC_LIBRARY) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"IMPORTED_LINK_INTERFACE_LANGUAGES","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
    if (pcVar3 == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"IMPORTED_LINK_INTERFACE_LANGUAGES","");
      pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        pcVar1 = (char *)(info->Languages)._M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&info->Languages,0,pcVar1,(ulong)pcVar3);
      }
    }
    else {
      pcVar1 = (char *)(info->Languages)._M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&info->Languages,0,pcVar1,(ulong)pcVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) goto LAB_0038938f;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"IMPORTED_LINK_INTERFACE_MULTIPLICITY","");
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
  pcVar3 = cmTarget::GetProperty(this->Target,&local_a0);
  if (pcVar3 == (char *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"IMPORTED_LINK_INTERFACE_MULTIPLICITY","");
    pcVar3 = cmTarget::GetProperty(this->Target,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) goto LAB_00389360;
  }
  else {
LAB_00389360:
    __isoc99_sscanf(pcVar3,"%u",&info->Multiplicity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_0038938f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                 ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, &loc, &imp, suffix))
    {
    return;
    }

  // Get the link interface.
  {
  std::string linkProp = "INTERFACE_LINK_LIBRARIES";
  const char *propertyLibs = this->GetProperty(linkProp);

  if (this->GetType() != cmState::INTERFACE_LIBRARY)
    {
    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      linkProp += suffix;
      propertyLibs = this->GetProperty(linkProp);
      }

    if(!propertyLibs)
      {
      linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
      propertyLibs = this->GetProperty(linkProp);
      }
    }
  if(propertyLibs)
    {
    info.LibrariesProp = linkProp;
    info.Libraries = propertyLibs;
    }
  }
  if(this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return;
    }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if(loc)
    {
    info.Location = loc;
    }
  else
    {
    std::string impProp = "IMPORTED_LOCATION";
    impProp += suffix;
    if(const char* config_location = this->GetProperty(impProp))
      {
      info.Location = config_location;
      }
    else if(const char* location = this->GetProperty("IMPORTED_LOCATION"))
      {
      info.Location = location;
      }
    }

  // Get the soname.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_SONAME";
    soProp += suffix;
    if(const char* config_soname = this->GetProperty(soProp))
      {
      info.SOName = config_soname;
      }
    else if(const char* soname = this->GetProperty("IMPORTED_SONAME"))
      {
      info.SOName = soname;
      }
    }

  // Get the "no-soname" mark.
  if(this->GetType() == cmState::SHARED_LIBRARY)
    {
    std::string soProp = "IMPORTED_NO_SONAME";
    soProp += suffix;
    if(const char* config_no_soname = this->GetProperty(soProp))
      {
      info.NoSOName = cmSystemTools::IsOn(config_no_soname);
      }
    else if(const char* no_soname = this->GetProperty("IMPORTED_NO_SONAME"))
      {
      info.NoSOName = cmSystemTools::IsOn(no_soname);
      }
    }

  // Get the import library.
  if(imp)
    {
    info.ImportLibrary = imp;
    }
  else if(this->GetType() == cmState::SHARED_LIBRARY ||
          this->IsExecutableWithExports())
    {
    std::string impProp = "IMPORTED_IMPLIB";
    impProp += suffix;
    if(const char* config_implib = this->GetProperty(impProp))
      {
      info.ImportLibrary = config_implib;
      }
    else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
      {
      info.ImportLibrary = implib;
      }
    }

  // Get the link dependencies.
  {
  std::string linkProp = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  linkProp += suffix;
  if(const char* config_libs = this->GetProperty(linkProp))
    {
    info.SharedDeps = config_libs;
    }
  else if(const char* libs =
          this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES"))
    {
    info.SharedDeps = libs;
    }
  }

  // Get the link languages.
  if(this->LinkLanguagePropagatesToDependents())
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    linkProp += suffix;
    if(const char* config_libs = this->GetProperty(linkProp))
      {
      info.Languages = config_libs;
      }
    else if(const char* libs =
            this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES"))
      {
      info.Languages = libs;
      }
    }

  // Get the cyclic repetition count.
  if(this->GetType() == cmState::STATIC_LIBRARY)
    {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
    linkProp += suffix;
    if(const char* config_reps = this->GetProperty(linkProp))
      {
      sscanf(config_reps, "%u", &info.Multiplicity);
      }
    else if(const char* reps =
            this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &info.Multiplicity);
      }
    }
}